

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotManager.cpp
# Opt level: O0

void __thiscall SlotManager::~SlotManager(SlotManager *this)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_> *in_RDI;
  iterator i;
  SlotMap toDelete;
  map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  *in_stack_ffffffffffffff98;
  map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  *in_stack_ffffffffffffffa0;
  Slot *pSVar3;
  _Self local_48;
  _Self local_40 [8];
  
  in_RDI->_M_node = (_Base_ptr)&PTR__SlotManager_00223d28;
  std::
  map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  ::map(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  ::clear((map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
           *)0x1eab7b);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
       ::begin(in_stack_ffffffffffffff98);
  while( true ) {
    local_48._M_node =
         (_Base_ptr)
         std::
         map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(local_40,&local_48);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_> *)0x1eabb8)
    ;
    pSVar3 = ppVar2->second;
    if (pSVar3 != (Slot *)0x0) {
      (*pSVar3->_vptr_Slot[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Slot_*const>_>::operator++
              (in_RDI,(int)((ulong)pSVar3 >> 0x20));
  }
  std::
  map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  ::~map((map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
          *)0x1eabf1);
  std::
  map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  ::~map((map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
          *)0x1eabff);
  return;
}

Assistant:

SlotManager::~SlotManager()
{
	SlotMap toDelete = slots;
	slots.clear();

	for (SlotMap::iterator i = toDelete.begin(); i != toDelete.end(); i++)
	{
		delete i->second;
	}
}